

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::basic_param::usage(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  static_any_base *psVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  param_cla_ids *ppVar5;
  param_cla_ids *ppVar6;
  read_access_t pbVar7;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  basic_param *in_RDI;
  bool optional_value_;
  parameter_cla_id *id;
  bool _fe_con_152;
  static_any_t _fe_end_152;
  static_any_t _fe_cur_152;
  basic_cstring<const_char> *in_stack_fffffffffffffee8;
  std_string *in_stack_fffffffffffffef0;
  std_string *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  std_string *psVar8;
  byte local_c1;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  basic_cstring<const_char> local_78;
  undefined1 local_68 [24];
  parameter_cla_id *local_50;
  byte local_44;
  __normal_iterator<const_boost::runtime::parameter_cla_id_*,_std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>_>
  local_40;
  static_any_base *local_38;
  __normal_iterator<const_boost::runtime::parameter_cla_id_*,_std::vector<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>_>
  local_28;
  std_string *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<((ostream *)in_RSI,"Parameter: ");
  poVar3 = std::operator<<(poVar3,(string *)&in_RDI->p_name);
  std::operator<<(poVar3,'\n');
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_10,' ');
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI->p_description);
    std::operator<<(poVar3,'\n');
  }
  std::operator<<((ostream *)local_10," Command line formats:\n");
  ppVar5 = cla_ids(in_RDI);
  ppVar6 = cla_ids(in_RDI);
  unit_test::for_each::
  is_const_coll<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>const>
            (ppVar6);
  integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x260be7);
  local_28._M_current =
       (parameter_cla_id *)
       unit_test::for_each::
       begin<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>>
                 (ppVar5);
  local_20 = (std_string *)&local_28;
  bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool((static_any_base *)local_20);
  if (!bVar2) {
    ppVar5 = cla_ids(in_RDI);
    ppVar6 = cla_ids(in_RDI);
    unit_test::for_each::
    is_const_coll<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>const>
              (ppVar6);
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x260c4f);
    local_40._M_current =
         (parameter_cla_id *)
         unit_test::for_each::
         end<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>>
                   (ppVar5);
    local_38 = (static_any_base *)&local_40;
    bVar2 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_38);
    if (!bVar2) {
      local_44 = 1;
      while( true ) {
        psVar8 = local_20;
        psVar1 = local_38;
        local_c1 = 0;
        if ((local_44 & 1) != 0) {
          ppVar5 = cla_ids(in_RDI);
          ppVar6 = cla_ids(in_RDI);
          unit_test::for_each::
          is_const_coll<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>const>
                    (ppVar6);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x260ce9);
          bVar2 = unit_test::for_each::
                  done<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>>
                            (psVar8,psVar1,ppVar5);
          local_c1 = bVar2 ^ 0xff;
        }
        if ((local_c1 & 1) == 0) break;
        local_44 = 0;
        psVar8 = local_20;
        ppVar5 = cla_ids(in_RDI);
        ppVar6 = cla_ids(in_RDI);
        unit_test::for_each::
        is_const_coll<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>const>
                  (ppVar6);
        integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x260d60);
        local_50 = unit_test::for_each::
                   deref<boost::runtime::parameter_cla_id_const&,std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>>
                             (psVar8,ppVar5);
        while (((local_44 ^ 0xff) & 1) != 0) {
          bVar2 = unit_test::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if (!bVar2) {
            poVar3 = std::operator<<((ostream *)local_10,"   ");
            std::operator<<(poVar3,(string *)local_50);
            if ((local_50->m_negatable & 1U) == 0) {
              in_stack_ffffffffffffff00 = local_10;
              unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)local_10,in_stack_fffffffffffffef8);
              unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)psVar8,(pointer)in_stack_ffffffffffffff08);
              (*in_RDI->_vptr_basic_param[7])(in_RDI,in_stack_ffffffffffffff00,local_88,local_98);
            }
            else {
              in_stack_ffffffffffffff08 = local_10;
              unit_test::basic_cstring<const_char>::basic_cstring
                        ((basic_cstring<const_char> *)in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8);
              unit_test::basic_cstring<const_char>::basic_cstring(&local_78,in_RDX);
              (*in_RDI->_vptr_basic_param[7])(in_RDI,in_stack_ffffffffffffff08,local_68,&local_78);
            }
            pbVar7 = unit_test::class_property::operator_cast_to_bool_
                               ((class_property *)&in_RDI->p_has_optional_value);
            bVar2 = (*pbVar7 & 1U) != 0;
            if (bVar2) {
              std::operator<<((ostream *)local_10,'[');
            }
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::operator<<((ostream *)local_10,(string *)&local_50->m_value_separator);
            }
            else {
              std::operator<<((ostream *)local_10,' ');
            }
            (*in_RDI->_vptr_basic_param[8])(in_RDI,local_10);
            if (bVar2) {
              std::operator<<((ostream *)local_10,']');
            }
            std::operator<<((ostream *)local_10,'\n');
          }
          local_44 = 1;
        }
        if ((local_44 & 1) == 0) {
          cla_ids(in_RDI);
        }
        else {
          in_stack_fffffffffffffef0 = local_20;
          in_stack_fffffffffffffef8 = (std_string *)cla_ids(in_RDI);
          ppVar5 = cla_ids(in_RDI);
          unit_test::for_each::
          is_const_coll<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>const>
                    (ppVar5);
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x260f95);
          unit_test::for_each::
          next<std::vector<boost::runtime::parameter_cla_id,std::allocator<boost::runtime::parameter_cla_id>>>
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
        }
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_10," Environment variable: ");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI->p_env_var);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

virtual void            usage( std::ostream& ostr, cstring negation_prefix_ )
    {
        ostr     << "Parameter: " << p_name << '\n';
        if( !p_description.empty() )
            ostr << ' ' << p_description << '\n';

        ostr     << " Command line formats:\n";
        BOOST_TEST_FOREACH( parameter_cla_id const&, id, cla_ids() ) {
            if( id.m_prefix == help_prefix )
                continue;

            ostr << "   " << id.m_prefix;
            if( id.m_negatable )
                cla_name_help( ostr, id.m_tag, negation_prefix_ );
            else
                cla_name_help( ostr, id.m_tag, "" );

            bool optional_value_ = false;

            if( p_has_optional_value ) {
                optional_value_ = true;
                ostr << '[';
            }

            if( id.m_value_separator.empty() )
                ostr << ' ';
            else {
                ostr << id.m_value_separator;
            }

            value_help( ostr );

            if( optional_value_ )
                ostr << ']';

            ostr << '\n';
        }
        if( !p_env_var.empty() )
            ostr << " Environment variable: " << p_env_var << '\n';
    }